

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O2

DdNode * Cudd_bddIthVar(DdManager *dd,int i)

{
  DdNode *pDVar1;
  
  if (0x7ffffffd < (uint)i) {
    return (DdNode *)0x0;
  }
  if (i < dd->size) {
    return dd->vars[(uint)i];
  }
  pDVar1 = cuddUniqueInter(dd,i,dd->one,(DdNode *)((ulong)dd->one ^ 1));
  return pDVar1;
}

Assistant:

DdNode *
Cudd_bddIthVar(
  DdManager * dd,
  int  i)
{
    DdNode *res;

    if ((unsigned int) i >= CUDD_MAXINDEX - 1) return(NULL);
    if (i < dd->size) {
        res = dd->vars[i];
    } else {
        res = cuddUniqueInter(dd,i,dd->one,Cudd_Not(dd->one));
    }

    return(res);

}